

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_>::~IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL,_4UL>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  _Var1;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  _Var2;
  _Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  _Var3;
  _Head_base<4UL,_testing::internal::ParamIterator<int>,_false> _Var4;
  
  (this->
  super_ParamIteratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>_>
  )._vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_0104d888;
  this_00 = (this->current_value_).
            super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->current_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->current_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var4._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
       super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl;
  if ((unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       )_Var4._M_head_impl.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
          )0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->current_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
  super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl =
       (ParamIterator<int>)0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->end_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->end_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->end_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->end_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var4._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (this->end_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
       super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl;
  if ((unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       )_Var4._M_head_impl.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
          )0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->end_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
  super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl =
       (ParamIterator<int>)0x0;
  _Var1.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ._M_head_impl =
       (this->begin_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  ;
  if (_Var1.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)0x0) {
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
  ._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
          )0x0;
  _Var2.
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>.
  _M_head_impl = (this->begin_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
                 .
                 super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>
                 ._M_head_impl.impl_._M_t.
                 super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
  ;
  if (_Var2.
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
      ._M_head_impl != (ParamIteratorInterface<libaom_test::TestMode> *)0x0) {
    (**(code **)(*(long *)_Var2.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
  _M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
       = (_Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
         )0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->begin_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<2UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
       = (this->begin_).
         super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .
         super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
         .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_.
         _M_t.
         super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
         .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>;
  if (_Var3.super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>.
      _M_head_impl != (ParamIteratorInterface<int> *)0x0) {
    (**(code **)(*(long *)_Var3.
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Head_base<3UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false> =
       (_Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>)0x0;
  _Var4._M_head_impl.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl =
       (this->begin_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .
       super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
       .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
       super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl;
  if ((unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
       )_Var4._M_head_impl.impl_._M_t.
        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
        .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>._M_head_impl
      != (unique_ptr<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
          )0x0) {
    (**(code **)(*(long *)_Var4._M_head_impl.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<int>,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<int>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<int>_*,_false>
                          ._M_head_impl + 8))();
  }
  (this->begin_).
  super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<2UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .
  super__Tuple_impl<3UL,_testing::internal::ParamIterator<int>,_testing::internal::ParamIterator<int>_>
  .super__Tuple_impl<4UL,_testing::internal::ParamIterator<int>_>.
  super__Head_base<4UL,_testing::internal::ParamIterator<int>,_false>._M_head_impl =
       (ParamIterator<int>)0x0;
  return;
}

Assistant:

~IteratorImpl() override {}